

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_form_suite.cpp
# Opt level: O2

void __thiscall reader_query_form_suite::test_single_space::test_method(test_single_space *this)

{
  view_type *pvVar1;
  bool bVar2;
  uint local_234;
  view_type local_230;
  undefined8 *local_220;
  char *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  query_form reader;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [22];
  
  local_230.ptr_ = input;
  builtin_strncpy(input,"alpha=hydrogen+helium",0x16);
  local_230.len_ = strlen(local_230.ptr_);
  trial::url::reader::basic_query_form<char>::basic_query_form(&reader,&local_230);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x30);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_70 = "";
  local_210._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_234 = 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_230,&local_78,0x30,2,2,&local_210,"reader.subcode()",&local_234,
             "url::token::subcode::query_form_key");
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x31);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_a0 = "";
  pvVar1 = &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[6]>
            (&local_230,&local_a8,0x31,2,2,pvVar1,"reader.literal()","alpha","\"alpha\"");
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x32);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1b8 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_210,pvVar1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_230,&local_1c0,0x32,2,2,&local_210,"reader.value<std::string>()","alpha",
             "\"alpha\"");
  std::__cxx11::string::~string((string *)&local_210);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x33);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1c8 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_210._M_dataplus._M_p._0_4_ = CONCAT31(local_210._M_dataplus._M_p._1_3_,bVar2);
  local_234 = CONCAT31(local_234._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_230,&local_1d0,0x33,2,2,&local_210,"reader.next()",&local_234,"true");
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x34);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_110 = "";
  local_210._M_dataplus._M_p._0_4_ =
       reader.super_base<char,_trial::url::reader::basic_query_form>.current_token;
  local_234 = 0xb;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_230,&local_118,0x34,2,2,&local_210,"reader.subcode()",&local_234,
             "url::token::subcode::query_form_value");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x35);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_140 = "";
  pvVar1 = &reader.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[16]>
            (&local_230,&local_148,0x35,2,2,pvVar1,"reader.literal()","hydrogen+helium",
             "\"hydrogen+helium\"");
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x36);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1d8 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_210,pvVar1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
            (&local_230,&local_1e0,0x36,2,2,&local_210,"reader.value<std::string>()",
             "hydrogen helium","\"hydrogen helium\"");
  std::__cxx11::string::~string((string *)&local_210);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_170 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x37);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1e8 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&reader);
  local_210._M_dataplus._M_p._0_4_ = CONCAT31(local_210._M_dataplus._M_p._1_3_,bVar2);
  local_234 = local_234 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_230,&local_1f0,0x37,2,2,&local_210,"reader.next()",&local_234,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_single_space)
{
    const char input[] = "alpha=hydrogen+helium";
    url::reader::query_form reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "hydrogen+helium");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "hydrogen helium");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}